

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_InitUndeclConsoleLetProperty(Var obj,PropertyId propertyId)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  uint16 uVar4;
  DynamicObject *obj_00;
  undefined4 *puVar5;
  void *aValue;
  ScriptContext *this;
  ThreadContext *threadContext;
  JavascriptLibrary *this_00;
  Var pvVar6;
  undefined1 local_48 [3];
  PropertyAttributes attributes;
  PropertyOperationFlags flags;
  JsReentLock reentrancylock;
  RecyclableObject *instance;
  FrameDisplay *pScope;
  PropertyId propertyId_local;
  Var obj_local;
  
  uVar4 = FrameDisplay::GetLength((FrameDisplay *)obj);
  obj_00 = (DynamicObject *)FrameDisplay::GetItem((FrameDisplay *)obj,uVar4 - 1);
  bVar3 = VarIs<Js::ConsoleScopeActivationObject,Js::DynamicObject>(obj_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xbdb,
                                "(VarIs<ConsoleScopeActivationObject>((DynamicObject*)pScope->GetItem(pScope->GetLength() - 1)))"
                                ,"How come we got this opcode without ConsoleScopeActivationObject?"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  aValue = FrameDisplay::GetItem((FrameDisplay *)obj,0);
  reentrancylock._24_8_ = VarTo<Js::RecyclableObject>(aValue);
  this = RecyclableObject::GetScriptContext((RecyclableObject *)reentrancylock._24_8_);
  threadContext = ScriptContext::GetThreadContext(this);
  JsReentLock::JsReentLock((JsReentLock *)local_48,threadContext);
  uVar2 = reentrancylock._24_8_;
  this_00 = RecyclableObject::GetLibrary((RecyclableObject *)reentrancylock._24_8_);
  pvVar6 = JavascriptLibrary::GetUndeclBlockVar(this_00);
  (**(code **)(*(long *)uVar2 + 0xf0))(uVar2,propertyId,pvVar6,0x47,0,0x90,0xf);
  JsReentLock::~JsReentLock((JsReentLock *)local_48);
  return 1;
}

Assistant:

BOOL JavascriptOperators::OP_InitUndeclConsoleLetProperty(Var obj, PropertyId propertyId)
    {
        FrameDisplay *pScope = (FrameDisplay*)obj;
        AssertMsg(VarIs<ConsoleScopeActivationObject>((DynamicObject*)pScope->GetItem(pScope->GetLength() - 1)), "How come we got this opcode without ConsoleScopeActivationObject?");
        RecyclableObject* instance = VarTo<RecyclableObject>(pScope->GetItem(0));
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_InitUndeclConsoleLetFld, reentrancylock, instance->GetScriptContext()->GetThreadContext());

        PropertyOperationFlags flags = static_cast<PropertyOperationFlags>(PropertyOperation_SpecialValue | PropertyOperation_AllowUndecl);
        PropertyAttributes attributes = PropertyLetDefaults;
        instance->SetPropertyWithAttributes(propertyId, instance->GetLibrary()->GetUndeclBlockVar(), attributes, NULL, flags);
        return TRUE;
        JIT_HELPER_END(Op_InitUndeclConsoleLetFld);
    }